

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void * xrealloc(void *ptr,size_t size)

{
  void *pvVar1;
  
  if (size != 0) {
    pvVar1 = realloc(ptr,size);
    if (pvVar1 != (void *)0x0) {
      return pvVar1;
    }
    die((char *)ptr);
  }
  free(ptr);
  return (void *)0x0;
}

Assistant:

static inline void* xrealloc(void* ptr, size_t size) {
    if (size == 0) {
        free(ptr);
        return NULL;
    }
    ptr = realloc(ptr, size);
    if (!ptr)
        die("not enough memory");
    return ptr;
}